

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeSet::_generatePattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  int32_t iVar1;
  UChar32 UVar2;
  UChar32 UVar3;
  int c;
  UnicodeString *pUVar4;
  int local_3c;
  int32_t i_2;
  UChar32 end_1;
  UChar32 start_1;
  int32_t i_1;
  UChar32 end;
  UChar32 start;
  int32_t i;
  int32_t count;
  UBool escapeUnprintable_local;
  UnicodeString *result_local;
  UnicodeSet *this_local;
  
  UnicodeString::append(result,L'[');
  iVar1 = getRangeCount(this);
  if (((iVar1 < 2) || (UVar2 = getRangeStart(this,0), UVar2 != 0)) ||
     (UVar2 = getRangeEnd(this,iVar1 + -1), UVar2 != 0x10ffff)) {
    for (end_1 = 0; end_1 < iVar1; end_1 = end_1 + 1) {
      UVar2 = getRangeStart(this,end_1);
      UVar3 = getRangeEnd(this,end_1);
      _appendToPat(result,UVar2,escapeUnprintable);
      if (UVar2 != UVar3) {
        if (UVar2 + 1 != UVar3) {
          UnicodeString::append(result,L'-');
        }
        _appendToPat(result,UVar3,escapeUnprintable);
      }
    }
  }
  else {
    UnicodeString::append(result,L'^');
    for (end = 1; end < iVar1; end = end + 1) {
      UVar2 = getRangeEnd(this,end + -1);
      UVar3 = getRangeStart(this,end);
      c = UVar3 + -1;
      _appendToPat(result,UVar2 + 1,escapeUnprintable);
      if (UVar2 + 1 != c) {
        if (UVar2 + 2 != c) {
          UnicodeString::append(result,L'-');
        }
        _appendToPat(result,c,escapeUnprintable);
      }
    }
  }
  for (local_3c = 0; iVar1 = UVector::size(this->strings), local_3c < iVar1; local_3c = local_3c + 1
      ) {
    UnicodeString::append(result,L'{');
    pUVar4 = (UnicodeString *)UVector::elementAt(this->strings,local_3c);
    _appendToPat(result,pUVar4,escapeUnprintable);
    UnicodeString::append(result,L'}');
  }
  pUVar4 = UnicodeString::append(result,L']');
  return pUVar4;
}

Assistant:

UnicodeString& UnicodeSet::_generatePattern(UnicodeString& result,
                                            UBool escapeUnprintable) const
{
    result.append(SET_OPEN);

//  // Check against the predefined categories.  We implicitly build
//  // up ALL category sets the first time toPattern() is called.
//  for (int8_t cat=0; cat<Unicode::GENERAL_TYPES_COUNT; ++cat) {
//      if (*this == getCategorySet(cat)) {
//          result.append(COLON);
//          result.append(CATEGORY_NAMES, cat*2, 2);
//          return result.append(CATEGORY_CLOSE);
//      }
//  }

    int32_t count = getRangeCount();

    // If the set contains at least 2 intervals and includes both
    // MIN_VALUE and MAX_VALUE, then the inverse representation will
    // be more economical.
    if (count > 1 &&
        getRangeStart(0) == MIN_VALUE &&
        getRangeEnd(count-1) == MAX_VALUE) {

        // Emit the inverse
        result.append(COMPLEMENT);

        for (int32_t i = 1; i < count; ++i) {
            UChar32 start = getRangeEnd(i-1)+1;
            UChar32 end = getRangeStart(i)-1;
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    // Default; emit the ranges as pairs
    else {
        for (int32_t i = 0; i < count; ++i) {
            UChar32 start = getRangeStart(i);
            UChar32 end = getRangeEnd(i);
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    for (int32_t i = 0; i<strings->size(); ++i) {
        result.append(OPEN_BRACE);
        _appendToPat(result,
                     *(const UnicodeString*) strings->elementAt(i),
                     escapeUnprintable);
        result.append(CLOSE_BRACE);
    }
    return result.append(SET_CLOSE);
}